

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_bpf2_init(ma_bpf2_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                      ma_bpf2 *pBPF)

{
  ma_result mVar1;
  void *pHeap;
  size_t heapSizeInBytes;
  
  mVar1 = ma_bpf2_get_heap_size(pConfig,&heapSizeInBytes);
  if (mVar1 == MA_SUCCESS) {
    if (heapSizeInBytes == 0) {
      pHeap = (void *)0x0;
    }
    else {
      pHeap = ma_malloc(heapSizeInBytes,pAllocationCallbacks);
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar1 = ma_bpf2_init_preallocated(pConfig,pHeap,pBPF);
    if (mVar1 == MA_SUCCESS) {
      (pBPF->bq)._ownsHeap = 1;
      mVar1 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_bpf2_init(const ma_bpf2_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_bpf2* pBPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_bpf2_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_bpf2_init_preallocated(pConfig, pHeap, pBPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBPF->bq._ownsHeap = MA_TRUE;    /* <-- This will cause the biquad to take ownership of the heap and free it when it's uninitialized. */
    return MA_SUCCESS;
}